

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O1

MPP_RET hal_task_group_init(HalTaskGroup *group,RK_S32 stage_cnt,RK_S32 task_cnt,RK_S32 task_size)

{
  int *piVar1;
  undefined8 *puVar2;
  MPP_RET MVar3;
  RK_S32 *pRVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  if ((group == (HalTaskGroup *)0x0) || ((task_cnt | stage_cnt | task_size) < 0)) {
    _mpp_log_l(2,"hal_task","found invalid input group %p stage %d task %d size %d\n",
               "hal_task_group_init",group,(ulong)(uint)stage_cnt,(ulong)(uint)task_cnt,
               (ulong)(uint)task_size);
    MVar3 = MPP_ERR_UNKNOW;
  }
  else {
    uVar9 = task_size + 7U & 0xfffffff8;
    uVar8 = (ulong)(uint)task_cnt;
    uVar10 = (ulong)(uint)stage_cnt;
    pRVar4 = (RK_S32 *)
             mpp_osal_calloc("hal_task_group_init",
                             ((long)(int)uVar9 + 0x28) * uVar8 + uVar10 * 0x14 + 0x40);
    if (pRVar4 == (RK_S32 *)0x0) {
      _mpp_log_l(2,"hal_task","malloc group failed\n","hal_task_group_init");
    }
    else {
      *pRVar4 = stage_cnt;
      pRVar4[1] = task_cnt;
      pRVar4[8] = task_size;
      pRVar4[9] = uVar9;
      *(RK_S32 **)(pRVar4 + 10) = pRVar4 + 0x10;
      *(RK_S32 **)(pRVar4 + 0xc) = pRVar4 + uVar10 * 4 + 0x10;
      *(RK_S32 **)(pRVar4 + 0xe) = pRVar4 + uVar10 * 4 + 0x10 + uVar10;
      mpp_spinlock_init((spinlock_t *)(pRVar4 + 2));
      if (0 < stage_cnt) {
        lVar5 = *(long *)(pRVar4 + 10);
        do {
          *(long *)lVar5 = lVar5;
          *(long *)(lVar5 + 8) = lVar5;
          lVar5 = lVar5 + 0x10;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      if (0 < task_cnt) {
        plVar6 = *(long **)(pRVar4 + 0xe);
        plVar7 = plVar6 + uVar8 * 5;
        lVar5 = *(long *)(pRVar4 + 10);
        piVar1 = *(int **)(pRVar4 + 0xc);
        uVar10 = 0;
        do {
          *plVar6 = (long)plVar6;
          plVar6[1] = (long)plVar6;
          *(int *)(plVar6 + 3) = (int)uVar10;
          plVar6[2] = (long)pRVar4;
          *(undefined4 *)((long)plVar6 + 0x1c) = 0;
          plVar6[4] = (long)plVar7;
          puVar2 = *(undefined8 **)(lVar5 + 8);
          *(long **)(lVar5 + 8) = plVar6;
          *plVar6 = lVar5;
          plVar6[1] = (long)puVar2;
          *puVar2 = plVar6;
          *piVar1 = *piVar1 + 1;
          uVar10 = uVar10 + 1;
          plVar7 = (long *)((long)plVar7 + (long)(int)uVar9);
          plVar6 = plVar6 + 5;
        } while (uVar8 != uVar10);
      }
      *group = pRVar4;
    }
    MVar3 = MPP_OK;
    if (pRVar4 == (RK_S32 *)0x0) {
      *group = (HalTaskGroup)0x0;
      MVar3 = MPP_NOK;
    }
  }
  return MVar3;
}

Assistant:

MPP_RET hal_task_group_init(HalTaskGroup *group, RK_S32 stage_cnt, RK_S32 task_cnt, RK_S32 task_size)
{
    if (NULL == group || stage_cnt < 0 || task_cnt < 0 || task_size < 0) {
        mpp_err_f("found invalid input group %p stage %d task %d size %d\n",
                  group, stage_cnt, task_cnt, task_size);
        return MPP_ERR_UNKNOW;
    }

    HalTaskGroupImpl *p = NULL;
    RK_S32 aligned_size = MPP_ALIGN(task_size, sizeof(void *));

    do {
        RK_U8 *buf = NULL;
        RK_S32 i;

        p = mpp_calloc_size(HalTaskGroupImpl, sizeof(HalTaskGroupImpl) +
                            (sizeof(HalTaskImpl) + aligned_size) * task_cnt +
                            (sizeof(struct list_head)) * stage_cnt +
                            (sizeof(RK_U32)) * stage_cnt);
        if (NULL == p) {
            mpp_err_f("malloc group failed\n");
            break;
        }

        p->stage_count = stage_cnt;
        p->task_count = task_cnt;
        p->size = task_size;
        p->aligned_size = aligned_size;
        p->list = (struct list_head *)((HalTaskImpl *)(p + 1));
        p->count = (RK_U32 *)(p->list + stage_cnt);
        p->tasks = (HalTaskImpl *)(p->count + stage_cnt);

        mpp_spinlock_init(&p->lock);

        for (i = 0; i < stage_cnt; i++)
            INIT_LIST_HEAD(&p->list[i]);

        buf = (RK_U8 *)(p->tasks + task_cnt);

        for (i = 0; i < task_cnt; i++) {
            HalTaskImpl *task = &p->tasks[i];

            INIT_LIST_HEAD(&task->list);
            task->index  = i;
            task->group  = p;
            task->status = TASK_IDLE;
            task->data   = buf + i * aligned_size;
            list_add_tail(&task->list, &p->list[TASK_IDLE]);
            p->count[TASK_IDLE]++;
        }
        *group = p;
        return MPP_OK;
    } while (0);

    MPP_FREE(p);

    *group = NULL;
    return MPP_NOK;
}